

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O1

Eci * __thiscall SGP4::FindPositionSDP4(Eci *__return_storage_ptr__,SGP4 *this,double tsince)

{
  SatelliteException *this_00;
  ulong uVar1;
  double cosio;
  double dVar2;
  double dVar3;
  double local_b0;
  double xn;
  double local_a0;
  double xmdf;
  double em;
  double xmam;
  double local_80;
  double local_78;
  double local_70;
  double xinc;
  double local_60;
  double local_58;
  double local_50;
  double e;
  double xnode;
  double omgadf;
  double local_30;
  
  local_a0 = (this->common_consts_).xmdot * tsince + (this->elements_).mean_anomoly_;
  xnode = (this->common_consts_).omgdot * tsince + (this->elements_).argument_perigee_;
  local_30 = tsince * tsince;
  e = (this->common_consts_).xnodcf * local_30 +
      (this->common_consts_).xnodot * tsince + (this->elements_).ascending_node_;
  local_60 = (this->common_consts_).t2cof;
  xmam = (this->common_consts_).c1;
  omgadf = (this->elements_).bstar_;
  local_58 = (this->common_consts_).c4;
  local_b0 = (this->elements_).recovered_mean_motion_;
  xmdf = (this->elements_).eccentricity_;
  local_70 = (this->elements_).inclination_;
  xinc = tsince;
  DeepSpaceSecular(tsince,&this->elements_,&this->common_consts_,&this->deepspace_consts_,
                   &this->integrator_params_,&local_a0,&xnode,&e,&xmdf,&local_70,&local_b0);
  if (local_b0 <= 0.0) {
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Error: (xn <= 0.0)");
  }
  else {
    local_30 = local_30 * local_60;
    omgadf = omgadf * local_58 * xinc;
    local_60 = pow(kXKE / local_b0,0.6666666666666666);
    local_50 = xmdf - omgadf;
    em = local_30 * (this->elements_).recovered_mean_motion_ + local_a0;
    DeepSpacePeriodics(xinc,&this->deepspace_consts_,&local_50,&local_70,&xnode,&e,&em);
    if (local_70 < 0.0) {
      local_70 = -local_70;
      e = e + 3.141592653589793;
      xnode = xnode + -3.141592653589793;
    }
    if (-0.001 < local_50) {
      omgadf = em;
      local_80 = xnode;
      local_58 = e;
      if (1e-06 <= local_50) {
        if (0.999999 < local_50) {
          local_50 = 0.999999;
        }
      }
      else {
        local_50 = 1e-06;
      }
      local_30 = local_70;
      local_78 = sin(local_70);
      cosio = cos(local_30);
      uVar1 = -(ulong)(1.5e-12 < ABS(cosio + 1.0));
      dVar3 = cosio * cosio;
      dVar2 = 1.0 - xmam * xinc;
      xn = (double)((long)(xinc * 60000000.0) + (this->elements_).epoch_.m_encoded);
      CalculateFinalPositionVelocity
                (__return_storage_ptr__,(DateTime *)&xn,local_50,local_60 * dVar2 * dVar2,local_80,
                 omgadf + local_80 + local_58,local_58,local_30,
                 ((cosio * 5.0 + 3.0) * local_78 * 0.000586267430002882) /
                 (double)(~uVar1 & 0x3d7a636641c4df1a | (ulong)(cosio + 1.0) & uVar1),
                 local_78 * 0.001172534860005764,dVar3 * 3.0 + -1.0,1.0 - dVar3,dVar3 * 7.0 + -1.0,
                 cosio,local_78);
      return __return_storage_ptr__;
    }
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Error: (e <= -0.001)");
  }
  __cxa_throw(this_00,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eci SGP4::FindPositionSDP4(double tsince) const
{
    /*
     * the final values
     */
    double e;
    double a;
    double omega;
    double xl;
    double xnode;
    double xinc;

    /*
     * update for secular gravity and atmospheric drag
     */
    double xmdf = elements_.MeanAnomoly()
        + common_consts_.xmdot * tsince;
    double omgadf = elements_.ArgumentPerigee()
        + common_consts_.omgdot * tsince;
    const double xnoddf = elements_.AscendingNode()
        + common_consts_.xnodot * tsince;

    const double tsq = tsince * tsince;
    xnode = xnoddf + common_consts_.xnodcf * tsq;
    double tempa = 1.0 - common_consts_.c1 * tsince;
    double tempe = elements_.BStar() * common_consts_.c4 * tsince;
    double templ = common_consts_.t2cof * tsq;

    double xn = elements_.RecoveredMeanMotion();
    double em = elements_.Eccentricity();
    xinc = elements_.Inclination();

    DeepSpaceSecular(tsince,
                     elements_,
                     common_consts_,
                     deepspace_consts_,
                     integrator_params_,
                     xmdf,
                     omgadf,
                     xnode,
                     em,
                     xinc,
                     xn);

    if (xn <= 0.0)
    {
        throw SatelliteException("Error: (xn <= 0.0)");
    }

    a = pow(kXKE / xn, kTWOTHIRD) * tempa * tempa;
    e = em - tempe;
    double xmam = xmdf + elements_.RecoveredMeanMotion() * templ;

    DeepSpacePeriodics(tsince,
                       deepspace_consts_,
                       e,
                       xinc,
                       omgadf,
                       xnode,
                       xmam);

    /*
     * keeping xinc positive important unless you need to display xinc
     * and dislike negative inclinations
     */
    if (xinc < 0.0)
    {
        xinc = -xinc;
        xnode += kPI;
        omgadf -= kPI;
    }

    xl = xmam + omgadf + xnode;
    omega = omgadf;

    /*
     * fix tolerance for error recognition
     */
    if (e <= -0.001)
    {
        throw SatelliteException("Error: (e <= -0.001)");
    }
    else if (e < 1.0e-6)
    {
        e = 1.0e-6;
    }
    else if (e > (1.0 - 1.0e-6))
    {
        e = 1.0 - 1.0e-6;
    }

    /*
     * re-compute the perturbed values
     */
    double perturbed_sinio;
    double perturbed_cosio;
    double perturbed_x3thm1;
    double perturbed_x1mth2;
    double perturbed_x7thm1;
    double perturbed_xlcof;
    double perturbed_aycof;
    RecomputeConstants(xinc,
                       perturbed_sinio,
                       perturbed_cosio,
                       perturbed_x3thm1,
                       perturbed_x1mth2,
                       perturbed_x7thm1,
                       perturbed_xlcof,
                       perturbed_aycof);

    /*
     * using calculated values, find position and velocity
     */
    return CalculateFinalPositionVelocity(elements_.Epoch().AddMinutes(tsince),
                                          e,
                                          a,
                                          omega,
                                          xl,
                                          xnode,
                                          xinc,
                                          perturbed_xlcof,
                                          perturbed_aycof,
                                          perturbed_x3thm1,
                                          perturbed_x1mth2,
                                          perturbed_x7thm1,
                                          perturbed_cosio,
                                          perturbed_sinio);
}